

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.h
# Opt level: O0

bool __thiscall
spvtools::opt::DominatorTree::Visit
          (DominatorTree *this,function<bool_(const_spvtools::opt::DominatorTreeNode_*)> *func)

{
  bool bVar1;
  reference pDVar2;
  undefined1 local_110 [8];
  DominatorTreeNode n;
  undefined1 local_d8 [8];
  const_iterator __end2;
  const_iterator __begin2;
  DominatorTree *__range2;
  function<bool_(const_spvtools::opt::DominatorTreeNode_*)> *func_local;
  DominatorTree *this_local;
  
  begin((const_iterator *)
        ((long)&__end2.parent_iterators_.c.
                super__Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish + 0x18),this);
  end((const_iterator *)local_d8,this);
  while (bVar1 = TreeDFIterator<const_spvtools::opt::DominatorTreeNode>::operator!=
                           ((TreeDFIterator<const_spvtools::opt::DominatorTreeNode> *)
                            ((long)&__end2.parent_iterators_.c.
                                    super__Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish + 0x18),
                            (TreeDFIterator<const_spvtools::opt::DominatorTreeNode> *)local_d8),
        bVar1) {
    pDVar2 = TreeDFIterator<const_spvtools::opt::DominatorTreeNode>::operator*
                       ((TreeDFIterator<const_spvtools::opt::DominatorTreeNode> *)
                        ((long)&__end2.parent_iterators_.c.
                                super__Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    DominatorTreeNode::DominatorTreeNode((DominatorTreeNode *)local_110,pDVar2);
    bVar1 = std::function<bool_(const_spvtools::opt::DominatorTreeNode_*)>::operator()
                      (func,(DominatorTreeNode *)local_110);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    n.dfs_num_post_ = (int)!bVar1;
    DominatorTreeNode::~DominatorTreeNode((DominatorTreeNode *)local_110);
    if (n.dfs_num_post_ != 0) goto LAB_009449d0;
    TreeDFIterator<const_spvtools::opt::DominatorTreeNode>::operator++
              ((TreeDFIterator<const_spvtools::opt::DominatorTreeNode> *)
               ((long)&__end2.parent_iterators_.c.
                       super__Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  }
  n.dfs_num_post_ = 2;
LAB_009449d0:
  TreeDFIterator<const_spvtools::opt::DominatorTreeNode>::~TreeDFIterator
            ((TreeDFIterator<const_spvtools::opt::DominatorTreeNode> *)local_d8);
  TreeDFIterator<const_spvtools::opt::DominatorTreeNode>::~TreeDFIterator
            ((TreeDFIterator<const_spvtools::opt::DominatorTreeNode> *)
             ((long)&__end2.parent_iterators_.c.
                     super__Deque_base<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<const_spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_*const_*,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  if (n.dfs_num_post_ != 1) {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Visit(std::function<bool(const DominatorTreeNode*)> func) const {
    for (auto n : *this) {
      if (!func(&n)) return false;
    }
    return true;
  }